

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O0

UINT32 ay8910_start(void **chip,UINT32 clock,UINT8 ay_type,UINT8 ay_flags)

{
  ay8910_context *info_00;
  ay8910_context *info;
  UINT8 ay_flags_local;
  UINT8 ay_type_local;
  UINT32 clock_local;
  void **chip_local;
  
  info_00 = (ay8910_context *)calloc(1,0x2e0);
  if (info_00 == (ay8910_context *)0x0) {
    chip_local._4_4_ = 0;
  }
  else {
    *chip = info_00;
    info_00->SmpRateFunc = (DEVCB_SRATE_CHG)0x0;
    info_00->clock = clock;
    info_00->chip_flags = ay_flags;
    ay8910_set_type(info_00,ay_type);
    info_00->res_load[2] = 1000;
    info_00->res_load[1] = 1000;
    info_00->res_load[0] = 1000;
    if ((info_00->chip_flags & 0x80) == 0) {
      info_00->StereoMask[0] = '\x03';
      info_00->StereoMask[1] = '\x03';
      info_00->StereoMask[2] = '\x03';
    }
    else {
      info_00->StereoMask[0] = '\x01';
      info_00->StereoMask[1] = '\x03';
      info_00->StereoMask[2] = '\x02';
    }
    build_mixer_table(info_00);
    ay8910_set_mute_mask(info_00,0);
    chip_local._4_4_ = ay8910_get_sample_rate(info_00);
  }
  return chip_local._4_4_;
}

Assistant:

UINT32 ay8910_start(void **chip, UINT32 clock, UINT8 ay_type, UINT8 ay_flags)
{
	ay8910_context *info;

	info = (ay8910_context*)calloc(1, sizeof(ay8910_context));
	if (info == NULL)
		return 0;
	*chip = info;

	info->SmpRateFunc = NULL;

	info->clock = clock;
	info->chip_flags = ay_flags;
	ay8910_set_type(info, ay_type);
	info->res_load[0] = info->res_load[1] = info->res_load[2] = 1000; //Default values for resistor loads
	
	if (info->chip_flags & AY8910_ZX_STEREO)
	{
		// ABC Stereo
		info->StereoMask[0] = 0x01;
		info->StereoMask[1] = 0x03;
		info->StereoMask[2] = 0x02;
	}
	else
	{
		info->StereoMask[0] = 0x03;
		info->StereoMask[1] = 0x03;
		info->StereoMask[2] = 0x03;
	}

	build_mixer_table(info);

	//ay8910_set_clock(info, clock);
	ay8910_set_mute_mask(info, 0x00);

	return ay8910_get_sample_rate(info);
}